

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O3

void __thiscall
TMap<int,_FPlayerColorSet,_THashTraits<int>,_TValueTraits<FPlayerColorSet>_>::CopyNodes
          (TMap<int,_FPlayerColorSet,_THashTraits<int>,_TValueTraits<FPlayerColorSet>_> *this,
          Node *nodes,hash_t numnodes)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  Node *pNVar4;
  int *piVar5;
  
  if (numnodes != 0) {
    piVar5 = &(nodes->Pair).Value.Lump;
    do {
      if (*(long *)(piVar5 + -4) != 1) {
        pNVar4 = NewKey(this,piVar5[-2]);
        (pNVar4->Pair).Value.Name.Index = (((FPlayerColorSet *)(piVar5 + -1))->Name).Index;
        uVar1 = *(undefined8 *)piVar5;
        uVar2 = *(undefined8 *)(piVar5 + 2);
        uVar3 = *(undefined8 *)(piVar5 + 6);
        *(undefined8 *)((pNVar4->Pair).Value.Extra + 2) = *(undefined8 *)(piVar5 + 4);
        *(undefined8 *)((pNVar4->Pair).Value.Extra + 4) = uVar3;
        *(undefined8 *)&(pNVar4->Pair).Value.Lump = uVar1;
        *(undefined8 *)(pNVar4->Pair).Value.Extra = uVar2;
      }
      numnodes = numnodes - 1;
      piVar5 = piVar5 + 0xc;
    } while (numnodes != 0);
  }
  return;
}

Assistant:

void CopyNodes(const Node *nodes, hash_t numnodes)
	{
		for (; numnodes-- > 0; ++nodes)
		{
			if (!nodes->IsNil())
			{
				Node *n = NewKey(nodes->Pair.Key);
				::new(&n->Pair.Value) VT(nodes->Pair.Value);
			}
		}
	}